

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_>::grow
          (basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> *this,size_t size)

{
  size_t __t;
  char32_t *pcVar1;
  pointer p;
  size_t sVar2;
  char32_t *__result;
  char32_t *local_68;
  char32_t *new_data;
  char32_t *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  size_t size_local;
  basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> *this_local;
  
  local_68 = (char32_t *)
             std::allocator_traits<std::allocator<char32_t>_>::max_size
                       ((allocator_type *)&this->field_0x7f0);
  __t = v8::detail::buffer<char32_t>::capacity(&this->super_buffer<char32_t>);
  pcVar1 = (char32_t *)(__t + (__t >> 1));
  old_data = (char32_t *)size;
  if ((size <= pcVar1) && (old_data = pcVar1, local_68 < pcVar1)) {
    if (local_68 < size) {
      local_68 = (char32_t *)size;
    }
    old_data = local_68;
  }
  pcVar1 = v8::detail::buffer<char32_t>::data(&this->super_buffer<char32_t>);
  p = std::allocator_traits<std::allocator<char32_t>_>::allocate
                ((allocator_type *)&this->field_0x7f0,(size_type)old_data);
  sVar2 = v8::detail::buffer<char32_t>::size(&this->super_buffer<char32_t>);
  __result = v8::detail::make_checked<char32_t>(p,(size_t)old_data);
  std::uninitialized_copy<char32_t*,char32_t*>(pcVar1,pcVar1 + sVar2,__result);
  v8::detail::buffer<char32_t>::set(&this->super_buffer<char32_t>,p,(size_t)old_data);
  if (pcVar1 != this->store_) {
    __gnu_cxx::new_allocator<char32_t>::deallocate
              ((new_allocator<char32_t> *)&this->field_0x7f0,pcVar1,__t);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}